

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_json.cpp
# Opt level: O1

ErrorStackOption *
ritobin::io::json_impl::json_value_impl<ritobin::Map,_(ritobin::Category)7>::from_json
          (ErrorStackOption *__return_storage_ptr__,Map *value,json *json)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  const_iterator cVar3;
  const_reference pvVar4;
  reference this;
  reference value_00;
  char *pcVar5;
  _Rb_tree_header *type;
  size_t index;
  undefined8 uVar6;
  _Alloc_hider _Var7;
  json_impl *this_00;
  string_view type_name;
  string_view type_name_00;
  string valueType_name;
  string keyType_name;
  const_iterator __begin3;
  const_iterator __end3;
  undefined1 local_1e8 [32];
  undefined1 local_1c8 [40];
  vector<ritobin::Pair,std::allocator<ritobin::Pair>> *local_1a0;
  string local_198;
  string local_178;
  string local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  undefined1 local_d8 [72];
  string local_90;
  const_iterator local_70;
  const_iterator local_50;
  
  if (json->m_type == object) {
    cVar3 = std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
            ::_M_find_tr<char[10],void>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                        *)(json->m_value).object,(char (*) [10])"valueType");
    if ((_Rb_tree_header *)cVar3._M_node ==
        &(((json->m_value).object)->_M_t)._M_impl.super__Rb_tree_header) {
      pcVar5 = "json.contains(\"valueType\")";
      goto LAB_0012afa7;
    }
    if ((json->m_type != object) ||
       (cVar3 = std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                ::_M_find_tr<char[8],void>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                            *)(json->m_value).object,(char (*) [8])"keyType"),
       (_Rb_tree_header *)cVar3._M_node ==
       &(((json->m_value).object)->_M_t)._M_impl.super__Rb_tree_header)) {
      pcVar5 = "json.contains(\"keyType\")";
      goto LAB_0012afa7;
    }
    if (json->m_type == object) {
      cVar3 = std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
              ::_M_find_tr<char[6],void>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                          *)(json->m_value).object,(char (*) [6])"items");
      type = &(((json->m_value).object)->_M_t)._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)cVar3._M_node != type) {
        pvVar4 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                             *)json,"valueType");
        if (pvVar4->m_type != string) {
          pcVar5 = "json[\"valueType\"].is_string()";
          goto LAB_0012afa7;
        }
        pvVar4 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                             *)json,"keyType");
        if (pvVar4->m_type != string) {
          pcVar5 = "json[\"keyType\"].is_string()";
          goto LAB_0012afa7;
        }
        pvVar4 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                             *)json,"items");
        if (pvVar4->m_type != array) {
          pcVar5 = "json[\"items\"].is_array()";
          goto LAB_0012afa7;
        }
        pvVar4 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                             *)json,"keyType");
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::
        get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (&local_f8,pvVar4);
        pvVar4 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                             *)json,"valueType");
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::
        get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (&local_118,pvVar4);
        type_name._M_str = (char *)value;
        type_name._M_len = (size_t)local_f8._M_dataplus._M_p;
        bVar2 = ValueHelperImpl<std::variant<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>_>
                ::try_type_name_to_type
                          ((ValueHelperImpl<std::variant<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>_>
                            *)local_f8._M_string_length,type_name,(Type *)type);
        if (bVar2) {
          type_name_00._M_str = (char *)&value->valueType;
          type_name_00._M_len = (size_t)local_118._M_dataplus._M_p;
          bVar2 = ValueHelperImpl<std::variant<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>_>
                  ::try_type_name_to_type
                            ((ValueHelperImpl<std::variant<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>_>
                              *)local_118._M_string_length,type_name_00,(Type *)type);
          if (bVar2) {
            pvVar4 = nlohmann::
                     basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                     ::operator[]<char_const>
                               ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                 *)json,"items");
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::cbegin(&local_70,pvVar4);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::cend(&local_50,pvVar4);
            local_1a0 = (vector<ritobin::Pair,std::allocator<ritobin::Pair>> *)&value->items;
            paVar1 = &(__return_storage_ptr__->
                      super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
                      _M_payload.
                      super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>
                      .super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload.
                      _M_value.path.field_2;
            this_00 = (json_impl *)0x0;
            while( true ) {
              bVar2 = nlohmann::detail::
                      iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ::operator==(&local_70,&local_50);
              if (bVar2) break;
              this = nlohmann::detail::
                     iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ::operator*(&local_70);
              ValueHelperImpl<std::variant<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>_>
              ::type_to_value((Value *)local_1e8,value->keyType);
              ValueHelperImpl<std::variant<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>_>
              ::type_to_value((Value *)local_d8,value->valueType);
              value_00 = std::vector<ritobin::Pair,std::allocator<ritobin::Pair>>::
                         emplace_back<std::variant<ritobin::None,ritobin::Bool,ritobin::I8,ritobin::U8,ritobin::I16,ritobin::U16,ritobin::I32,ritobin::U32,ritobin::I64,ritobin::U64,ritobin::F32,ritobin::Vec2,ritobin::Vec3,ritobin::Vec4,ritobin::Mtx44,ritobin::RGBA,ritobin::String,ritobin::Hash,ritobin::File,ritobin::List,ritobin::List2,ritobin::Pointer,ritobin::Embed,ritobin::Link,ritobin::Option,ritobin::Map,ritobin::Flag>,std::variant<ritobin::None,ritobin::Bool,ritobin::I8,ritobin::U8,ritobin::I16,ritobin::U16,ritobin::I32,ritobin::U32,ritobin::I64,ritobin::U64,ritobin::F32,ritobin::Vec2,ritobin::Vec3,ritobin::Vec4,ritobin::Mtx44,ritobin::RGBA,ritobin::String,ritobin::Hash,ritobin::File,ritobin::List,ritobin::List2,ritobin::Pointer,ritobin::Embed,ritobin::Link,ritobin::Option,ritobin::Map,ritobin::Flag>>
                                   (local_1a0,(Value *)local_1e8,(Value *)local_d8);
              std::__detail::__variant::
              _Variant_storage<false,_ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
              ::~_Variant_storage((_Variant_storage<false,_ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
                                   *)local_d8);
              std::__detail::__variant::
              _Variant_storage<false,_ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
              ::~_Variant_storage((_Variant_storage<false,_ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
                                   *)local_1e8);
              if (this->m_type == object) {
                cVar3 = std::
                        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                        ::_M_find_tr<char[4],void>
                                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                                    *)(this->m_value).object,(char (*) [4])0x13e625);
                if (cVar3._M_node ==
                    (_Base_ptr)
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                      *)(this->m_value).object + 8)) {
                  local_1e8._8_8_ = "json.contains(\"key\")";
                  goto LAB_0012ada9;
                }
                if ((this->m_type != object) ||
                   (cVar3 = std::
                            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                            ::_M_find_tr<char[6],void>
                                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                                        *)(this->m_value).object,(char (*) [6])"value"),
                   (_Rb_tree_header *)cVar3._M_node ==
                   &(((this->m_value).object)->_M_t)._M_impl.super__Rb_tree_header)) {
                  local_1e8._8_8_ = "json.contains(\"value\")";
                  goto LAB_0012ada9;
                }
                pvVar4 = nlohmann::
                         basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         ::operator[]<char_const>
                                   ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                     *)this,"key");
                value_from_json(__return_storage_ptr__,&value_00->key,pvVar4);
                if ((__return_storage_ptr__->
                    super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
                    _M_payload.
                    super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
                    super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_engaged ==
                    true) {
                  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
                  local_178.field_2._M_local_buf[2] = 'y';
                  local_178.field_2._M_allocated_capacity._0_2_ = 0x656b;
                  local_178._M_string_length = 3;
                  local_178.field_2._M_local_buf[3] = '\0';
                  to_index((string *)local_d8,&local_178);
                  ErrorStack::push((ErrorStack *)__return_storage_ptr__,(string *)local_d8);
                  if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
                    operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_178._M_dataplus._M_p != &local_178.field_2) {
                    operator_delete(local_178._M_dataplus._M_p,
                                    CONCAT44(local_178.field_2._M_allocated_capacity._4_4_,
                                             CONCAT13(local_178.field_2._M_local_buf[3],
                                                      CONCAT12(local_178.field_2._M_local_buf[2],
                                                               local_178.field_2.
                                                               _M_allocated_capacity._0_2_))) + 1);
                  }
                }
                else {
                  pvVar4 = nlohmann::
                           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                           ::operator[]<char_const>
                                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                       *)this,"value");
                  value_from_json(__return_storage_ptr__,&value_00->value,pvVar4);
                  if ((__return_storage_ptr__->
                      super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
                      _M_payload.
                      super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>
                      .super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_engaged
                      == true) {
                    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
                    local_198.field_2._M_local_buf[4] = 'e';
                    local_198.field_2._M_allocated_capacity._0_4_ = 0x756c6176;
                    local_198._M_string_length = 5;
                    local_198.field_2._M_local_buf[5] = '\0';
                    to_index(&local_90,&local_198);
                    ErrorStack::push((ErrorStack *)__return_storage_ptr__,&local_90);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_90._M_dataplus._M_p != &local_90.field_2) {
                      operator_delete(local_90._M_dataplus._M_p,
                                      local_90.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_198._M_dataplus._M_p != &local_198.field_2) {
                      operator_delete(local_198._M_dataplus._M_p,
                                      CONCAT26(local_198.field_2._M_allocated_capacity._6_2_,
                                               CONCAT15(local_198.field_2._M_local_buf[5],
                                                        CONCAT14(local_198.field_2._M_local_buf[4],
                                                                 local_198.field_2.
                                                                 _M_allocated_capacity._0_4_))) + 1)
                      ;
                    }
                  }
                  else {
                    (__return_storage_ptr__->
                    super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
                    _M_payload.
                    super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
                    super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_engaged =
                         false;
                  }
                }
              }
              else {
                local_1e8._8_8_ = "json.is_object()";
LAB_0012ada9:
                local_1e8._0_8_ = "pair";
                local_1e8._16_8_ = local_1c8;
                (__return_storage_ptr__->
                super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload.
                super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
                super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload._M_value
                .type = "pair";
                (__return_storage_ptr__->
                super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload.
                super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
                super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload._M_value
                .message = (char *)local_1e8._8_8_;
                *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  **)((long)&(__return_storage_ptr__->
                             super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)
                             ._M_payload.
                             super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>
                             .super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>.
                             _M_payload + 0x10) = paVar1;
                paVar1->_M_allocated_capacity = (ulong)(uint7)local_1c8._1_7_ << 8;
                *(ulong *)((long)&(__return_storage_ptr__->
                                  super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>
                                  )._M_payload.
                                  super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>
                                  .super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>.
                                  _M_payload._M_value.path.field_2 + 8) =
                     CONCAT17(local_1c8[0xf],
                              CONCAT25(local_1c8._13_2_,CONCAT41(local_1c8._9_4_,local_1c8[8])));
                (__return_storage_ptr__->
                super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload.
                super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
                super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload._M_value
                .path._M_string_length = 0;
                local_1e8._24_8_ = 0;
                local_1c8[0] = 0;
                (__return_storage_ptr__->
                super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload.
                super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
                super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_engaged = true;
              }
              bVar2 = (__return_storage_ptr__->
                      super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
                      _M_payload.
                      super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>
                      .super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_engaged;
              if (bVar2 == true) {
                local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"items","");
                to_index((string *)local_1e8,&local_158);
                to_index_abi_cxx11_((string *)local_d8,this_00,index);
                std::operator+(&local_138,(string *)local_1e8,(string *)local_d8);
                ErrorStack::push((ErrorStack *)__return_storage_ptr__,&local_138);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_138._M_dataplus._M_p != &local_138.field_2) {
                  operator_delete(local_138._M_dataplus._M_p,
                                  local_138.field_2._M_allocated_capacity + 1);
                }
                if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
                  operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
                }
                if ((undefined1 *)local_1e8._0_8_ != local_1e8 + 0x10) {
                  operator_delete((void *)local_1e8._0_8_,(ulong)(local_1e8._16_8_ + 1));
                }
                uVar6 = local_158.field_2._M_allocated_capacity;
                _Var7._M_p = local_158._M_dataplus._M_p;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_158._M_dataplus._M_p != &local_158.field_2) {
LAB_0012af1f:
                  operator_delete(_Var7._M_p,uVar6 + 1);
                }
              }
              else if ((__return_storage_ptr__->
                       super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
                       _M_payload.
                       super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>
                       .super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_engaged
                       == true) {
                (__return_storage_ptr__->
                super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload.
                super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
                super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_engaged = false;
                _Var7._M_p = (__return_storage_ptr__->
                             super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)
                             ._M_payload.
                             super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>
                             .super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>.
                             _M_payload._M_value.path._M_dataplus._M_p;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)_Var7._M_p != paVar1) {
                  uVar6 = paVar1->_M_allocated_capacity;
                  goto LAB_0012af1f;
                }
              }
              if (bVar2 != false) goto LAB_0012b0fc;
              this_00 = this_00 + 1;
              nlohmann::detail::
              iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::operator++(&local_70);
            }
            (__return_storage_ptr__->
            super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload.
            super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
            super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_engaged = false;
            goto LAB_0012b0fc;
          }
          local_1e8._8_8_ = "ValueHelper::try_type_name_to_type(valueType_name, value.valueType)";
        }
        else {
          local_1e8._8_8_ = "ValueHelper::try_type_name_to_type(keyType_name, value.keyType)";
        }
        local_1e8._0_8_ = "map";
        local_1e8._16_8_ = local_1c8;
        (__return_storage_ptr__->
        super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload.
        super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
        super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload._M_value.type =
             "map";
        (__return_storage_ptr__->
        super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload.
        super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
        super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload._M_value.message
             = (char *)local_1e8._8_8_;
        (__return_storage_ptr__->
        super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload.
        super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
        super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload._M_value.path.
        _M_dataplus._M_p =
             (pointer)((long)&(__return_storage_ptr__->
                              super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>
                              )._M_payload.
                              super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>
                              .super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>.
                              _M_payload + 0x20);
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->
                 super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload.
                 super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
                 super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload + 0x20)
             = 0;
        *(ulong *)((long)&(__return_storage_ptr__->
                          super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
                          _M_payload.
                          super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>
                          .super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>.
                          _M_payload._M_value.path.field_2 + 1) =
             CONCAT17(local_1c8[8],local_1c8._1_7_);
        *(undefined4 *)
         ((long)&(__return_storage_ptr__->
                 super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload.
                 super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
                 super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload + 0x29)
             = local_1c8._9_4_;
        *(undefined2 *)
         ((long)&(__return_storage_ptr__->
                 super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload.
                 super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
                 super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload + 0x2d)
             = local_1c8._13_2_;
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->
                 super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload.
                 super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
                 super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload + 0x2f)
             = local_1c8[0xf];
        (__return_storage_ptr__->
        super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload.
        super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
        super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload._M_value.path.
        _M_string_length = 0;
        local_1e8._24_8_ = 0;
        local_1c8[0] = 0;
        (__return_storage_ptr__->
        super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload.
        super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
        super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_engaged = true;
LAB_0012b0fc:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p == &local_f8.field_2) {
          return __return_storage_ptr__;
        }
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        return __return_storage_ptr__;
      }
    }
    pcVar5 = "json.contains(\"items\")";
  }
  else {
    pcVar5 = "json.is_object()";
  }
LAB_0012afa7:
  (__return_storage_ptr__->super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
  _M_payload.super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
  super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload._M_value.type = "map";
  (__return_storage_ptr__->super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
  _M_payload.super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
  super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload._M_value.message =
       pcVar5;
  (__return_storage_ptr__->super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
  _M_payload.super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
  super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload._M_value.path.
  _M_dataplus._M_p =
       (pointer)((long)&(__return_storage_ptr__->
                        super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
                        _M_payload.
                        super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>
                        .super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload
                + 0x20);
  *(undefined1 *)
   ((long)&(__return_storage_ptr__->
           super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload.
           super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
           super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload + 0x20) = 0;
  *(ulong *)((long)&(__return_storage_ptr__->
                    super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
                    _M_payload.
                    super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
                    super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload.
                    _M_value.path.field_2 + 1) = CONCAT17(local_1c8[8],local_1c8._1_7_);
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->
           super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload.
           super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
           super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload + 0x29) =
       local_1c8._9_4_;
  *(undefined2 *)
   ((long)&(__return_storage_ptr__->
           super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload.
           super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
           super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload + 0x2d) =
       local_1c8._13_2_;
  *(undefined1 *)
   ((long)&(__return_storage_ptr__->
           super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload.
           super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
           super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload + 0x2f) =
       local_1c8[0xf];
  (__return_storage_ptr__->super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
  _M_payload.super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
  super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload._M_value.path.
  _M_string_length = 0;
  (__return_storage_ptr__->super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
  _M_payload.super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
  super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_engaged = true;
  return __return_storage_ptr__;
}

Assistant:

static ErrorStackOption from_json(T& value, json const& json) noexcept {
            bin_json_assert(json.is_object());
            bin_json_assert(json.contains("valueType"));
            bin_json_assert(json.contains("keyType"));
            bin_json_assert(json.contains("items"));
            bin_json_assert(json["valueType"].is_string());
            bin_json_assert(json["keyType"].is_string());
            bin_json_assert(json["items"].is_array());
            std::string keyType_name = json["keyType"];
            std::string valueType_name = json["valueType"];
            bin_json_assert(ValueHelper::try_type_name_to_type(keyType_name, value.keyType));
            bin_json_assert(ValueHelper::try_type_name_to_type(valueType_name, value.valueType));
            auto const& json_items = json["items"];
            size_t index = 0;
            for (auto const& json_item: json_items) {
                auto& value_item = value.items.emplace_back(ValueHelper::type_to_value(value.keyType),
                                                            ValueHelper::type_to_value(value.valueType));
                bin_json_rethrow(to_index("items") + to_index(index),
                                 item_from_json(value_item, json_item));
                ++index;
            }
            return std::nullopt;
        }